

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O2

void scroll_arrow_draw_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  uint *puVar1;
  bool active;
  bool depressed;
  int iVar2;
  int iVar3;
  int width;
  int height;
  uint uVar4;
  Am_Value *pAVar5;
  char *error_string;
  Computed_Colors_Record color_rec;
  Am_Widget_Look look;
  
  pAVar5 = Am_Object::Get(self,100,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x65,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x66,0);
  width = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x67,0);
  height = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0xcc,0);
  active = Am_Value::operator_cast_to_bool(pAVar5);
  pAVar5 = Am_Object::Get(self,0x173,0);
  depressed = Am_Value::operator_cast_to_bool(pAVar5);
  pAVar5 = Am_Object::Get(self,0x1ad,0);
  color_rec.data = (Computed_Colors_Record_Data *)(pAVar5->value).wrapper_value;
  if (color_rec.data != (Computed_Colors_Record_Data *)0x0) {
    puVar1 = &((color_rec.data)->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  pAVar5 = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&look,pAVar5);
  pAVar5 = Am_Object::Get(self,0x1b1,0);
  uVar4 = Am_Value::operator_cast_to_int(pAVar5);
  if (((look.value == Am_MOTIF_LOOK.value) || (look.value == Am_WINDOWS_LOOK.value)) ||
     (look.value == Am_MACINTOSH_LOOK.value)) {
    if (uVar4 < 4) {
      iVar2 = iVar2 + x_offset;
      iVar3 = iVar3 + y_offset;
      switch(uVar4) {
      case 0:
        draw_up_arrow(iVar2,iVar3,width,height,look,depressed,active,&color_rec,drawonable);
        break;
      case 1:
        draw_down_arrow(iVar2,iVar3,width,height,look,depressed,active,false,&color_rec,drawonable);
        break;
      case 2:
        draw_left_arrow(iVar2,iVar3,width,height,look,depressed,active,&color_rec,drawonable);
        break;
      case 3:
        draw_right_arrow(iVar2,iVar3,width,height,look,depressed,active,&color_rec,drawonable);
      }
      Computed_Colors_Record::~Computed_Colors_Record(&color_rec);
      return;
    }
    error_string = "Bad Am_Scroll_Arrow_Direction in arrow object";
  }
  else {
    error_string = "Illegal look detected in scroll_arrow_draw";
  }
  Am_Error(error_string);
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, scroll_arrow_draw,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  bool active = self.Get(Am_ACTIVE);
  bool interim_selected = self.Get(Am_INTERIM_SELECTED);
  Computed_Colors_Record color_rec = self.Get(Am_STYLE_RECORD);
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  Am_Scroll_Arrow_Direction dir =
      (Am_Scroll_Arrow_Direction)(int)self.Get(Am_SCROLL_ARROW_DIRECTION);

  if ((look != Am_MOTIF_LOOK) && (look != Am_WINDOWS_LOOK) &&
      (look != Am_MACINTOSH_LOOK))
    Am_Error("Illegal look detected in scroll_arrow_draw");

  // finally ready to draw it
  switch (dir) {
  case Am_SCROLL_ARROW_UP:
    draw_up_arrow(left, top, width, height, look, interim_selected, active,
                  color_rec, drawonable);
    break;

  case Am_SCROLL_ARROW_DOWN:
    draw_down_arrow(left, top, width, height, look, interim_selected, active,
                    false, color_rec, drawonable);
    break;

  case Am_SCROLL_ARROW_LEFT:
    draw_left_arrow(left, top, width, height, look, interim_selected, active,
                    color_rec, drawonable);
    break;

  case Am_SCROLL_ARROW_RIGHT:
    draw_right_arrow(left, top, width, height, look, interim_selected, active,
                     color_rec, drawonable);
    break;

  default:
    Am_Error("Bad Am_Scroll_Arrow_Direction in arrow object");
  } // end switch
}